

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void __thiscall
jpgd::jpeg_decoder::decode_scan(jpeg_decoder *this,pDecode_block_func decode_block_func)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int m_block_y_mcu [4];
  int block_x_mcu [4];
  int local_68 [4];
  ulong local_58;
  pDecode_block_func local_50;
  int local_48 [6];
  
  local_50 = decode_block_func;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  if (0 < this->m_mcus_per_col) {
    uVar4 = 0;
    do {
      local_58 = uVar4;
      local_48[0] = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      local_48[3] = 0;
      if (0 < this->m_mcus_per_row) {
        iVar3 = 0;
        do {
          if ((this->m_restart_interval != 0) && (this->m_restarts_left == 0)) {
            process_restart(this);
          }
          if (0 < this->m_blocks_per_mcu) {
            lVar8 = 0;
            iVar7 = 0;
            iVar6 = 0;
            do {
              iVar1 = this->m_mcu_org[lVar8];
              iVar5 = local_48[iVar1];
              (*local_50)(this,iVar1,iVar5 + iVar6,local_68[iVar1] + iVar7);
              if (this->m_comps_in_scan == 1) {
                iVar5 = iVar5 + 1;
LAB_00123afb:
                local_48[iVar1] = iVar5;
              }
              else {
                iVar6 = iVar6 + 1;
                if (iVar6 == this->m_comp_h_samp[iVar1]) {
                  iVar7 = iVar7 + 1;
                  iVar6 = 0;
                  if (iVar7 == this->m_comp_v_samp[iVar1]) {
                    iVar5 = this->m_comp_h_samp[iVar1] + iVar5;
                    iVar6 = 0;
                    iVar7 = 0;
                    goto LAB_00123afb;
                  }
                }
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < this->m_blocks_per_mcu);
          }
          this->m_restarts_left = this->m_restarts_left + -1;
          iVar3 = iVar3 + 1;
        } while (iVar3 < this->m_mcus_per_row);
      }
      uVar2 = this->m_comps_in_scan;
      if ((ulong)uVar2 == 1) {
        local_68[this->m_comp_list[0]] = local_68[this->m_comp_list[0]] + 1;
      }
      else if (0 < (int)uVar2) {
        uVar4 = 0;
        do {
          local_68[this->m_comp_list[uVar4]] =
               local_68[this->m_comp_list[uVar4]] + this->m_comp_v_samp[this->m_comp_list[uVar4]];
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      uVar4 = (ulong)((int)local_58 + 1U);
    } while ((int)((int)local_58 + 1U) < this->m_mcus_per_col);
  }
  return;
}

Assistant:

void jpeg_decoder::decode_scan(pDecode_block_func decode_block_func) {
  int mcu_row, mcu_col, mcu_block;
  int block_x_mcu[JPGD_MAX_COMPONENTS], m_block_y_mcu[JPGD_MAX_COMPONENTS];

  memset(m_block_y_mcu, 0, sizeof(m_block_y_mcu));

  for (mcu_col = 0; mcu_col < m_mcus_per_col; mcu_col++) {
    int component_num, component_id;

    memset(block_x_mcu, 0, sizeof(block_x_mcu));

    for (mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++) {
      int block_x_mcu_ofs = 0, block_y_mcu_ofs = 0;

      if ((m_restart_interval) && (m_restarts_left == 0))
        process_restart();

      for (mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++) {
        component_id = m_mcu_org[mcu_block];

        decode_block_func(this, component_id, block_x_mcu[component_id] + block_x_mcu_ofs, m_block_y_mcu[component_id] + block_y_mcu_ofs);

        if (m_comps_in_scan == 1)
          block_x_mcu[component_id]++;
        else {
          if (++block_x_mcu_ofs == m_comp_h_samp[component_id]) {
            block_x_mcu_ofs = 0;

            if (++block_y_mcu_ofs == m_comp_v_samp[component_id]) {
              block_y_mcu_ofs = 0;
              block_x_mcu[component_id] += m_comp_h_samp[component_id];
            }
          }
        }
      }

      m_restarts_left--;
    }

    if (m_comps_in_scan == 1)
      m_block_y_mcu[m_comp_list[0]]++;
    else {
      for (component_num = 0; component_num < m_comps_in_scan; component_num++) {
        component_id = m_comp_list[component_num];
        m_block_y_mcu[component_id] += m_comp_v_samp[component_id];
      }
    }
  }
}